

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

bool __thiscall re2::Regexp::ParseState::MaybeConcatString(ParseState *this,int r,ParseFlags flags)

{
  uint16_t in_DX;
  int in_ESI;
  long in_RDI;
  Regexp *in_stack_00000010;
  int i;
  Rune rune;
  Regexp *re2;
  Regexp *re1;
  int local_30;
  Regexp *pRVar1;
  Regexp *this_00;
  bool local_1;
  
  this_00 = *(Regexp **)(in_RDI + 0x20);
  if ((this_00 == (Regexp *)0x0) || (pRVar1 = this_00->down_, pRVar1 == (Regexp *)0x0)) {
    local_1 = false;
  }
  else if ((this_00->op_ == '\x03') || (this_00->op_ == '\x04')) {
    if ((pRVar1->op_ == '\x03') || (pRVar1->op_ == '\x04')) {
      if ((this_00->parse_flags_ & 1) == (pRVar1->parse_flags_ & 1)) {
        if (pRVar1->op_ == '\x03') {
          pRVar1->op_ = '\x04';
          (pRVar1->field_7).field_0.max_ = 0;
          (pRVar1->field_7).field_1.name_ = (string *)0x0;
          AddRuneToString(this_00,(Rune)((ulong)pRVar1 >> 0x20));
        }
        if (this_00->op_ == '\x03') {
          AddRuneToString(this_00,(Rune)((ulong)pRVar1 >> 0x20));
        }
        else {
          for (local_30 = 0; local_30 < (this_00->field_7).field_0.max_; local_30 = local_30 + 1) {
            AddRuneToString(this_00,(Rune)((ulong)pRVar1 >> 0x20));
          }
          (this_00->field_7).field_0.max_ = 0;
          if ((this_00->field_7).the_union_[1] != (void *)0x0) {
            operator_delete__((this_00->field_7).the_union_[1]);
          }
          (this_00->field_7).field_1.name_ = (string *)0x0;
        }
        if (in_ESI < 0) {
          *(Regexp **)(in_RDI + 0x20) = pRVar1;
          Decref(in_stack_00000010);
          local_1 = false;
        }
        else {
          this_00->op_ = '\x03';
          (this_00->field_7).field_0.max_ = in_ESI;
          this_00->parse_flags_ = in_DX;
          local_1 = true;
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Regexp::ParseState::MaybeConcatString(int r, ParseFlags flags) {
  Regexp* re1;
  Regexp* re2;
  if ((re1 = stacktop_) == NULL || (re2 = re1->down_) == NULL)
    return false;

  if (re1->op_ != kRegexpLiteral && re1->op_ != kRegexpLiteralString)
    return false;
  if (re2->op_ != kRegexpLiteral && re2->op_ != kRegexpLiteralString)
    return false;
  if ((re1->parse_flags_ & FoldCase) != (re2->parse_flags_ & FoldCase))
    return false;

  if (re2->op_ == kRegexpLiteral) {
    // convert into string
    Rune rune = re2->rune_;
    re2->op_ = kRegexpLiteralString;
    re2->nrunes_ = 0;
    re2->runes_ = NULL;
    re2->AddRuneToString(rune);
  }

  // push re1 into re2.
  if (re1->op_ == kRegexpLiteral) {
    re2->AddRuneToString(re1->rune_);
  } else {
    for (int i = 0; i < re1->nrunes_; i++)
      re2->AddRuneToString(re1->runes_[i]);
    re1->nrunes_ = 0;
    delete[] re1->runes_;
    re1->runes_ = NULL;
  }

  // reuse re1 if possible
  if (r >= 0) {
    re1->op_ = kRegexpLiteral;
    re1->rune_ = r;
    re1->parse_flags_ = static_cast<uint16_t>(flags);
    return true;
  }

  stacktop_ = re2;
  re1->Decref();
  return false;
}